

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

void __thiscall ccs::CcsContext::Builder::Builder(Builder *this,Builder *that)

{
  _Head_base<0UL,_ccs::CcsContext::Builder::Impl_*,_false> this_00;
  
  this_00._M_head_impl = (Impl *)operator_new(0x48);
  Impl::Impl(this_00._M_head_impl,
             (that->impl)._M_t.
             super___uniq_ptr_impl<ccs::CcsContext::Builder::Impl,_std::default_delete<ccs::CcsContext::Builder::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_ccs::CcsContext::Builder::Impl_*,_std::default_delete<ccs::CcsContext::Builder::Impl>_>
             .super__Head_base<0UL,_ccs::CcsContext::Builder::Impl_*,_false>._M_head_impl);
  (this->impl)._M_t.
  super___uniq_ptr_impl<ccs::CcsContext::Builder::Impl,_std::default_delete<ccs::CcsContext::Builder::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_ccs::CcsContext::Builder::Impl_*,_std::default_delete<ccs::CcsContext::Builder::Impl>_>
  .super__Head_base<0UL,_ccs::CcsContext::Builder::Impl_*,_false>._M_head_impl =
       this_00._M_head_impl;
  return;
}

Assistant:

CcsContext::Builder::Builder(const Builder &that) :
    impl(new Impl(*that.impl)) {}